

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdge * __thiscall ON_SubD::EdgeFromId(ON_SubD *this,uint edge_id)

{
  element_type *peVar1;
  ON_SubDEdge *pOVar2;
  
  if ((1 < edge_id + 1) &&
     (peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    pOVar2 = ON_SubDHeap::EdgeFromId(&peVar1->m_heap,edge_id);
    return pOVar2;
  }
  return (ON_SubDEdge *)0x0;
}

Assistant:

const class ON_SubDEdge* ON_SubD::EdgeFromId(
  unsigned int edge_id
  ) const
{
  for (;;)
  {
    if (0 == edge_id || ON_UNSET_UINT_INDEX == edge_id )
      break;
    const ON_SubDimple* subdimple = SubDimple();
    if (nullptr == subdimple)
      break;
    return subdimple->EdgeFromId(edge_id);
  }
  return nullptr;
}